

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

int __thiscall helics::readSize(helics *this,string_view val)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> V;
  string_view val_local;
  
  val_local._M_str = (char *)val._M_len;
  iVar1 = 0;
  val_local._M_len = (size_t)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,'[',0);
  if (sVar2 < 2) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&val_local," ]",sVar2 + 1
                      );
    if (sVar3 != 0xffffffffffffffff) {
      iVar1 = 0;
      for (; val_local._M_len != sVar2; sVar2 = sVar2 + 1) {
        iVar1 = iVar1 + (uint)(val_local._M_str[sVar2] == ';' || val_local._M_str[sVar2] == ',');
      }
      iVar1 = iVar1 + 1;
    }
  }
  else {
    V = std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,1,sVar2 - 1);
    iVar1 = gmlc::utilities::numConv<int>(V);
  }
  return iVar1;
}

Assistant:

static int readSize(std::string_view val)
{
    auto firstBracket = val.find_first_of('[');
    if (firstBracket > 1) {
        try {
            auto size = numConv<int>(val.substr(1, firstBracket - 1));
            return size;
        }
        // NOLINTNEXTLINE
        catch (const std::invalid_argument&) {
            // go to the alternative path if this fails
        }
    }
    if (val.find_first_not_of(" ]", firstBracket + 1) == std::string_view::npos) {
        return 0;
    }
    auto res = std::count_if(val.begin() + firstBracket,
                             val.end(),
                             [](auto nextChar) { return (nextChar == ',') || (nextChar == ';'); }) +
        1;
    return static_cast<int>(res);
}